

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O1

int check(char *a)

{
  char cVar1;
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  
  r = svstatus_get();
  if (r == -1) {
    iVar6 = -1;
  }
  else {
    bVar3 = *a;
    if (bVar3 != 0) {
      pbVar5 = (byte *)(a + 1);
      iVar6 = 0;
      do {
        uVar2 = svstatus._12_4_;
        if (r == 0) {
          return (uint)(bVar3 == 0x78) * 2 + -1;
        }
        if (bVar3 < 0x6b) {
          if (bVar3 == 0x43) {
            if (svstatus._12_4_ != 0) goto LAB_00102d44;
          }
          else if (bVar3 == 99) {
            cVar1 = svstatus[0x10];
            if (svstatus._12_4_ != 0) goto joined_r0x00102d68;
          }
          else if (bVar3 == 100) {
            cVar1 = svstatus[0x13];
            if (svstatus._12_4_ != 0) {
              return 0;
            }
joined_r0x00102d68:
            if (cVar1 != '\0') {
              return 0;
            }
          }
        }
        else {
          switch(bVar3) {
          case 0x6b:
          case 0x74:
            if ((svstatus._12_4_ != 0) || (svstatus[0x11] != 'd')) {
              tai_unpack(svstatus,&tstatus);
              if (uVar2 == 0) {
                return 0;
              }
              if (tstatus.x < tstart.sec.x) {
                return 0;
              }
              if (svstatus[0x12] != '\0') {
                return 0;
              }
              goto LAB_00102d44;
            }
            break;
          case 0x6f:
            tai_unpack(svstatus,&tstatus);
            if ((uVar2 == 0) && (tstatus.x < tstart.sec.x)) {
              return 0;
            }
            if ((uVar2 != 0) && (svstatus[0x11] != 'd')) {
              return 0;
            }
            break;
          case 0x70:
            if ((svstatus._12_4_ != 0) && (svstatus[0x10] == '\0')) {
              return 0;
            }
            break;
          case 0x75:
            if (svstatus._12_4_ == 0) {
              return 0;
            }
            if (svstatus[0x13] != '\x01') {
              return 0;
            }
LAB_00102d44:
            iVar4 = checkscript();
            if (iVar4 == 0) {
              return 0;
            }
            break;
          case 0x78:
            goto switchD_00102c5e_caseD_78;
          }
        }
        bVar3 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar3 != 0);
    }
    buffer_puts(buffer_1,"ok: ");
    svstatus_print(*service);
    buffer_puts(buffer_1,"\n");
    buffer_flush(buffer_1);
    iVar6 = 1;
  }
switchD_00102c5e_caseD_78:
  return iVar6;
}

Assistant:

int check(char *a) {
  unsigned int pid;

  if ((r =svstatus_get()) == -1) return(-1);
  while (*a) {
    if (r == 0) { if (*a == 'x') return(1); return(-1); }
    pid =(unsigned char)svstatus[15];
    pid <<=8; pid +=(unsigned char)svstatus[14];
    pid <<=8; pid +=(unsigned char)svstatus[13];
    pid <<=8; pid +=(unsigned char)svstatus[12];
    switch (*a) {
    case 'x': return(0);
    case 'u':
      if (!pid || svstatus[19] != 1) return(0);
      if (!checkscript()) return(0);
      break;
    case 'd': if (pid || svstatus[19] != 0) return(0); break;
    case 'C': if (pid) if (!checkscript()) return(0); break;
    case 't':
    case 'k':
      if (!pid && svstatus[17] == 'd') break;
      tai_unpack(svstatus, &tstatus);
      if ((tstart.sec.x > tstatus.x) || !pid || svstatus[18] || !checkscript())
        return(0);
      break;
    case 'o':
      tai_unpack(svstatus, &tstatus);
      if ((!pid && tstart.sec.x > tstatus.x) || (pid && svstatus[17] != 'd'))
        return(0);
      break;
    case 'p': if (pid && !svstatus[16]) return(0); break;
    case 'c': if (pid && svstatus[16]) return(0); break;
    }
    ++a;
  }
  outs(OK); svstatus_print(*service); flush("\n");
  return(1);
}